

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.h
# Opt level: O2

double __thiscall CEPlanet::XCoordinate_Deg(CEPlanet *this,double new_date)

{
  double dVar1;
  CEAngle local_60;
  CEDate local_50;
  
  (*(this->super_CEBody).super_CESkyCoord._vptr_CESkyCoord[0xe])();
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_50,dVar1,JD);
  (*(this->super_CEBody).super_CESkyCoord._vptr_CESkyCoord[3])(&local_60,this,&local_50);
  dVar1 = CEAngle::Deg(&local_60);
  CEAngle::~CEAngle(&local_60);
  CEDate::~CEDate(&local_50);
  return dVar1;
}

Assistant:

inline
double CEPlanet::XCoordinate_Deg(double new_date) const
{
    UpdateCoordinates(new_date);
    return XCoord().Deg();
}